

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
mjs::object::add_own_property_names
          (object *this,vector<mjs::string,_std::allocator<mjs::string>_> *names,
          bool check_enumerable)

{
  bool bVar1;
  gc_vector<mjs::object::property> *this_00;
  gc_heap *pgVar2;
  gc_heap *pgVar3;
  gc_heap *h;
  property local_40;
  
  this_00 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::dereference
                      (&this->properties_,this->heap_);
  pgVar2 = (gc_heap *)gc_vector<mjs::object::property>::tab(this_00);
  pgVar3 = (gc_heap *)gc_vector<mjs::object::property>::end(this_00);
  while (h = (gc_heap *)&pgVar2->alloc_context_, h != pgVar3) {
    if ((!check_enumerable) ||
       (bVar1 = has_attributes(*(property_attribute *)
                                ((long)&((gc_table *)&pgVar2->alloc_context_)->heap_ + 4),dont_enum)
       , pgVar2 = h, !bVar1)) {
      property::key(&local_40,h);
      std::vector<mjs::string,_std::allocator<mjs::string>_>::emplace_back<mjs::string>
                (names,(string *)&local_40);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_40);
      pgVar2 = h;
    }
  }
  return;
}

Assistant:

void object::add_own_property_names(std::vector<string>& names, bool check_enumerable) const {
    for (auto& p : properties_.dereference(heap_)) { 
        if (!check_enumerable || !has_attributes(p.attributes(), property_attribute::dont_enum)) {
            names.push_back(p.key(heap_));
        }
    }
}